

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O2

FT_Bool tt_face_get_colr_layer
                  (TT_Face face,FT_UInt base_glyph,FT_UInt *aglyph_index,FT_UInt *acolor_index,
                  FT_LayerIterator *iterator)

{
  void *pvVar1;
  long lVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort *puVar9;
  uint uVar10;
  
  pvVar1 = face->colr;
  if (pvVar1 == (void *)0x0) {
    return '\0';
  }
  puVar9 = (ushort *)iterator->p;
  if (puVar9 == (ushort *)0x0) {
    iterator->layer = 0;
    lVar2 = *(long *)((long)pvVar1 + 8);
    uVar7 = 0;
    uVar8 = (uint)*(ushort *)((long)pvVar1 + 2);
    do {
      while( true ) {
        if (uVar8 < uVar7 || uVar8 - uVar7 == 0) goto LAB_00208410;
        uVar6 = (uVar8 - uVar7 >> 1) + uVar7;
        uVar5 = (ulong)(uVar6 * 6);
        uVar10 = (uint)(ushort)(*(ushort *)(lVar2 + uVar5) << 8 | *(ushort *)(lVar2 + uVar5) >> 8);
        if (base_glyph <= uVar10) break;
        uVar7 = uVar6 + 1;
      }
      uVar8 = uVar6;
    } while (base_glyph < uVar10);
    uVar3 = *(ushort *)(lVar2 + 4 + uVar5);
    uVar3 = uVar3 << 8 | uVar3 >> 8;
    if (uVar3 != 0) {
      uVar4 = *(ushort *)(lVar2 + 2 + uVar5);
      uVar4 = uVar4 << 8 | uVar4 >> 8;
      uVar8 = (uint)uVar3;
      iterator->num_layers = uVar8;
      uVar7 = 0;
      if (*(ulong *)((long)pvVar1 + 0x88) < (ulong)((uVar4 + uVar8) * 4)) goto LAB_00208412;
      puVar9 = (ushort *)((ulong)uVar4 * 4 + *(long *)((long)pvVar1 + 0x10));
      iterator->p = (FT_Byte *)puVar9;
      goto LAB_00208308;
    }
  }
  else {
    uVar8 = iterator->num_layers;
    uVar7 = iterator->layer;
LAB_00208308:
    if (((uVar7 < uVar8) && (*(ushort **)((long)pvVar1 + 0x10) <= puVar9)) &&
       (puVar9 < (ushort *)(*(long *)((long)pvVar1 + 0x80) + *(long *)((long)pvVar1 + 0x88)))) {
      iterator->p = (FT_Byte *)(puVar9 + 1);
      *aglyph_index = (uint)(ushort)(*puVar9 << 8 | *puVar9 >> 8);
      iterator->p = (FT_Byte *)(puVar9 + 2);
      uVar3 = puVar9[1] << 8 | puVar9[1] >> 8;
      *acolor_index = (uint)uVar3;
      if ((*aglyph_index < (uint)(face->root).num_glyphs) &&
         ((uVar3 == 0xffff || (uVar3 < (face->palette_data).num_palette_entries)))) {
        iterator->layer = iterator->layer + 1;
        uVar7 = 1;
        goto LAB_00208412;
      }
    }
  }
LAB_00208410:
  uVar7 = 0;
LAB_00208412:
  return (FT_Bool)uVar7;
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_colr_layer( TT_Face            face,
                          FT_UInt            base_glyph,
                          FT_UInt           *aglyph_index,
                          FT_UInt           *acolor_index,
                          FT_LayerIterator*  iterator )
  {
    Colr*            colr = (Colr*)face->colr;
    BaseGlyphRecord  glyph_record;


    if ( !colr )
      return 0;

    if ( !iterator->p )
    {
      FT_ULong  offset;


      /* first call to function */
      iterator->layer = 0;

      if ( !find_base_glyph_record( colr->base_glyphs,
                                    colr->num_base_glyphs,
                                    base_glyph,
                                    &glyph_record ) )
        return 0;

      if ( glyph_record.num_layers )
        iterator->num_layers = glyph_record.num_layers;
      else
        return 0;

      offset = LAYER_SIZE * glyph_record.first_layer_index;
      if ( offset + LAYER_SIZE * glyph_record.num_layers > colr->table_size )
        return 0;

      iterator->p = colr->layers + offset;
    }

    if ( iterator->layer >= iterator->num_layers                     ||
         iterator->p < colr->layers                                  ||
         iterator->p >= ( (FT_Byte*)colr->table + colr->table_size ) )
      return 0;

    *aglyph_index = FT_NEXT_USHORT( iterator->p );
    *acolor_index = FT_NEXT_USHORT( iterator->p );

    if ( *aglyph_index >= (FT_UInt)( FT_FACE( face )->num_glyphs )   ||
         ( *acolor_index != 0xFFFF                                 &&
           *acolor_index >= face->palette_data.num_palette_entries ) )
      return 0;

    iterator->layer++;

    return 1;
  }